

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNHeap::InitializeScan(TopNHeap *this,TopNScanState *state,bool exclude_offset)

{
  undefined8 uVar1;
  reference pvVar2;
  idx_t iVar3;
  long lVar4;
  idx_t i;
  ulong __n;
  unsafe_vector<TopNEntry> heap_copy;
  
  ::std::vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::vector
            (&heap_copy.super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>,
             &(this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(state->scan_order).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             ((long)heap_copy.super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)heap_copy.super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                   super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl
                   .super__Vector_impl_data._M_start) / 0x18);
  lVar4 = 0x10;
  for (__n = 0; __n < (ulong)(((long)heap_copy.
                                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                     .
                                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)heap_copy.
                                    super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                    .
                                    super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    uVar1 = *(undefined8 *)
             ((long)&((heap_copy.super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>
                       .super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start)->sort_key).value + lVar4);
    pvVar2 = vector<unsigned_int,_true>::get<true>(&state->scan_order,__n);
    *pvVar2 = (value_type)uVar1;
    lVar4 = lVar4 + 0x18;
  }
  if (exclude_offset) {
    iVar3 = this->offset;
  }
  else {
    iVar3 = 0;
  }
  state->pos = iVar3;
  ::std::_Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>::~_Vector_base
            ((_Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_> *)&heap_copy);
  return;
}

Assistant:

void TopNHeap::InitializeScan(TopNScanState &state, bool exclude_offset) {
	auto heap_copy = heap;
	state.scan_order.resize(heap_copy.size());

	// we sorted the heap in Finalize(), so we can sequentially here
	// we do this because sorting the heap is much more efficient than popping one by one
	for (idx_t i = 0; i < heap_copy.size(); i++) {
		state.scan_order[i] = UnsafeNumericCast<sel_t>(heap_copy[i].index);
	}

	state.pos = exclude_offset ? offset : 0;
}